

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

int minTemp2_fast(word *pInOut,int iVar,int iQ,int jQ,int nWords,int *pDifStart)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar1 = (byte)iVar;
  iVar2 = jQ << (bVar1 & 0x1f);
  uVar4 = (ulong)(uint)nWords;
  iVar3 = nWords * 100 + 0x14;
  while( true ) {
    if ((int)uVar4 < 1) {
      *pDifStart = 0;
      return 0 << (bVar1 & 0x1f);
    }
    if (0x3f < iVar2) break;
    uVar6 = (SFmask[iVar][iQ] & pInOut[uVar4 - 1]) << ((byte)(iQ << (bVar1 & 0x1f)) & 0x3f);
    uVar5 = (pInOut[uVar4 - 1] & SFmask[iVar][jQ]) << ((byte)iVar2 & 0x3f);
    iVar3 = iVar3 + -100;
    uVar4 = uVar4 - 1;
    if (uVar6 != uVar5) {
      iVar2 = firstShiftWithOneBit(uVar5 ^ uVar6,1 << (bVar1 & 0x1f));
      *pDifStart = iVar3 - iVar2;
      return (uint)(uVar5 < uVar6);
    }
  }
  __assert_fail("jQ*blockSize < 64",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast16.c"
                ,0xbc,"int minTemp2_fast(word *, int, int, int, int, int *)");
}

Assistant:

int minTemp2_fast(word* pInOut, int iVar, int iQ, int jQ, int nWords, int* pDifStart)
{
    int i, blockSize = 1<<iVar;
    word temp;
    for(i=nWords - 1; i>=0; i--)
    {
        assert( jQ*blockSize < 64 );
        temp = ((pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize)) ^ ((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize));
        if( temp == 0)
            continue;
        else
        {
            *pDifStart = i*100 + 20 - firstShiftWithOneBit(temp, blockSize);
            if( ((pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize)) <= ((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize)) )
                return 0;
            else
                return 1;
        }
    }
    *pDifStart=0;
    return 0;
}